

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int archive_write_pax_finish_entry(archive_write *a)

{
  long lVar1;
  int iVar2;
  archive_write *in_RDI;
  sparse_block_conflict *sb;
  int ret;
  uint64_t remaining;
  pax *pax;
  long *length;
  
  length = (long *)in_RDI->format_data;
  if (*length == 0) {
    while (length[0xc] != 0) {
      lVar1 = *(long *)length[0xc];
      free((void *)length[0xc]);
      length[0xc] = lVar1;
    }
  }
  iVar2 = __archive_write_nulls(in_RDI,(size_t)length);
  length[1] = 0;
  *length = 0;
  return iVar2;
}

Assistant:

static int
archive_write_pax_finish_entry(struct archive_write *a)
{
	struct pax *pax;
	uint64_t remaining;
	int ret;

	pax = (struct pax *)a->format_data;
	remaining = pax->entry_bytes_remaining;
	if (remaining == 0) {
		while (pax->sparse_list) {
			struct sparse_block *sb;
			if (!pax->sparse_list->is_hole)
				remaining += pax->sparse_list->remaining;
			sb = pax->sparse_list->next;
			free(pax->sparse_list);
			pax->sparse_list = sb;
		}
	}
	ret = __archive_write_nulls(a, (size_t)(remaining + pax->entry_padding));
	pax->entry_bytes_remaining = pax->entry_padding = 0;
	return (ret);
}